

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  bool bVar1;
  string *psVar2;
  string *args_2;
  ostream *poVar3;
  undefined1 local_2d0 [8];
  cmGeneratedFileStream fout;
  char local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char local_2a;
  byte local_29;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *filename;
  
  local_29 = 0;
  local_28 = target;
  target_local = (cmGeneratorTarget *)lg;
  lg_local = (cmLocalGenerator *)this;
  this_local = (cmExtraCodeBlocksGenerator *)__return_storage_ptr__;
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  local_2a = '/';
  (*(code *)target_local->Target[0x10].impl._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>)(&local_50,target_local,local_28);
  local_51 = '/';
  args_2 = cmGeneratorTarget::GetName_abi_cxx11_(local_28);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[8]>
            (__return_storage_ptr__,psVar2,&local_2a,&local_50,&local_51,args_2,
             (char (*) [8])".objlib");
  std::__cxx11::string::~string((string *)&local_50);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2d0,__return_storage_ptr__,false,None);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(local_2d0 + (long)*(_func_int **)((long)local_2d0 + -0x18)));
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)local_2d0,"# This is a dummy file for the OBJECT library ");
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(local_28);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    poVar3 = std::operator<<(poVar3," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar3,"# Don\'t edit, this file will be overwritten.\n");
  }
  local_29 = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2d0);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(target), '/',
                                  target->GetName(), ".objlib");
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}